

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char_const*>(Capturer *this,size_t index,char **value)

{
  string local_40;
  char **local_20;
  char **value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_20 = value;
  value_local = (char **)index;
  index_local = (size_t)this;
  Detail::stringify<char_const*>(&local_40,(Detail *)value,value);
  captureValue(this,index,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }